

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(char8_t *s,ostream *os)

{
  ostream *os_local;
  char8_t *s_local;
  
  anon_unknown_37::PrintCStringTo<char8_t>(s,os);
  return;
}

Assistant:

void PrintTo(const char8_t* s, ostream* os) { PrintCStringTo(s, os); }